

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  long lVar3;
  unsigned_long uVar4;
  char *pcVar5;
  size_t insize;
  long lVar6;
  char **ppcVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  char *local_48;
  long local_40;
  size_t size;
  
  uVar4 = authstatus->picked;
  if (uVar4 == 1) {
    if (proxy) {
      if ((((ulong)conn->bits & 4) == 0) ||
         (pcVar10 = Curl_checkProxyheaders(data,conn,"Proxy-authorization",0x13),
         pcVar10 != (char *)0x0)) goto LAB_00130e22;
      lVar9 = 0x13b8;
      lVar6 = 0x13c0;
      lVar3 = 0x13c8;
LAB_00130f58:
      size = 0;
      local_48 = (char *)0x0;
      pcVar10 = *(char **)((long)&data->magic + lVar6);
      pcVar5 = "";
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "";
      }
      pcVar8 = *(char **)((long)&data->magic + lVar3);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "";
      }
      pcVar10 = curl_maprintf("%s:%s",pcVar10,pcVar8);
      if (pcVar10 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      local_40 = lVar9;
      insize = strlen(pcVar10);
      CVar2 = Curl_base64_encode(pcVar10,insize,&local_48,&size);
      lVar3 = local_40;
      if (CVar2 == CURLE_OK) {
        if (local_48 == (char *)0x0) {
          CVar2 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((long)&data->magic + local_40));
          if (proxy) {
            pcVar5 = "Proxy-";
          }
          pcVar5 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar5,local_48);
          *(char **)((long)&data->magic + lVar3) = pcVar5;
          (*Curl_cfree)(local_48);
          CVar2 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)&data->magic + lVar3) != 0) {
            CVar2 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar10);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pcVar10 = "Basic";
    }
    else {
      if (((data->state).aptr.user != (char *)0x0) &&
         (pcVar10 = Curl_checkheaders(data,"Authorization",0xd), pcVar10 == (char *)0x0)) {
        lVar9 = 0x1370;
        lVar6 = 0x13a8;
        lVar3 = 0x13b0;
        goto LAB_00130f58;
      }
LAB_00130e22:
      pcVar10 = (char *)0x0;
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  else if (uVar4 == 2) {
    CVar2 = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar10 = "Digest";
  }
  else if (uVar4 == 8) {
    CVar2 = Curl_output_ntlm(data,proxy);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar10 = "NTLM";
  }
  else {
    if (uVar4 != 0x80) {
      pcVar10 = (char *)0x0;
      goto LAB_00130e36;
    }
    CVar2 = Curl_output_aws_sigv4(data,proxy);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar10 = "AWS_SIGV4";
  }
  uVar4 = authstatus->picked;
LAB_00130e36:
  if (uVar4 == 0x40) {
    if (((!proxy) && ((data->set).str[0x3c] != (char *)0x0)) &&
       (pcVar5 = Curl_checkheaders(data,"Authorization",0xd), pcVar5 == (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.userpwd);
      pcVar10 = curl_maprintf("Authorization: Bearer %s\r\n",(data->set).str[0x3c]);
      (data->state).aptr.userpwd = pcVar10;
      if (pcVar10 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar10 = "Bearer";
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  if (pcVar10 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
      pcVar5 = "Server";
      if (proxy) {
        pcVar5 = "Proxy";
      }
      ppcVar7 = &(data->state).aptr.user;
      if (proxy) {
        ppcVar7 = &(data->state).aptr.proxyuser;
      }
      pcVar8 = "";
      if (*ppcVar7 != (char *)0x0) {
        pcVar8 = *ppcVar7;
      }
      Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar5,pcVar10,pcVar8);
    }
    authstatus->field_0x18 =
         (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
  (void)conn;

#ifdef CURL_DISABLE_DIGEST_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_AWS
  if(authstatus->picked == CURLAUTH_AWS_SIGV4) {
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, STRCONST("Proxy-authorization"))) ||
#endif
      (!proxy && data->state.aptr.user &&
       !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    (void)proxy;
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return result;
}